

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O3

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenNumType(Lexer *this,uint64_t num)

{
  size_t sVar1;
  int iVar2;
  NumberToken *this_00;
  TokenType type;
  uint64_t in_RDX;
  Token *last;
  Position local_48;
  Error<pfederc::LexerErrorCode> *local_30;
  
  iVar2 = *(int *)(num + 0xb0);
  if (iVar2 - 0x30U < 10) {
    getCurrentCursor(&local_48,(Lexer *)num);
    sVar1 = *(size_t *)(num + 0xa8);
    local_30 = (Error<pfederc::LexerErrorCode> *)operator_new(0x38);
    local_30->logLevel = LVL_ERROR;
    local_30->err = LEX_ERR_NUM_UNEXPECTED_CHAR_DIGIT;
    (local_30->pos).line = local_48.line;
    (local_30->pos).startIndex = sVar1;
    (local_30->pos).endIndex = sVar1;
    (local_30->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_30->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_30->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                        *)num);
    if (local_30 == (Error<pfederc::LexerErrorCode> *)0x0) {
      return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
             (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
    }
    std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>::operator()
              ((default_delete<pfederc::Error<pfederc::LexerErrorCode>_> *)&local_30,local_30);
    return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
           (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
  }
  this_00 = (NumberToken *)0x0;
  if (iVar2 < 0x6c) {
    if (iVar2 == 0x4c) {
      nextChar((Lexer *)num);
      getCurrentCursor(&local_48,(Lexer *)num);
      this_00 = (NumberToken *)operator_new(0x38);
      last = *(Token **)(num + 0xb8);
      type = TOK_INT64;
    }
    else {
      if (iVar2 != 0x53) goto LAB_0010ae7c;
      nextChar((Lexer *)num);
      getCurrentCursor(&local_48,(Lexer *)num);
      this_00 = (NumberToken *)operator_new(0x38);
      last = *(Token **)(num + 0xb8);
      type = TOK_INT16;
    }
  }
  else {
    if (iVar2 == 0x6c) {
      nextChar((Lexer *)num);
LAB_0010ad28:
      this_00 = (NumberToken *)0x0;
      goto LAB_0010ae7c;
    }
    if (iVar2 == 0x73) {
      nextChar((Lexer *)num);
      getCurrentCursor(&local_48,(Lexer *)num);
      this_00 = (NumberToken *)operator_new(0x38);
      last = *(Token **)(num + 0xb8);
      type = TOK_INT8;
    }
    else {
      if (iVar2 != 0x75) goto LAB_0010ae7c;
      iVar2 = nextChar((Lexer *)num);
      if (iVar2 < 0x6c) {
        if (iVar2 == 0x4c) {
          nextChar((Lexer *)num);
          getCurrentCursor(&local_48,(Lexer *)num);
          this_00 = (NumberToken *)operator_new(0x38);
          last = *(Token **)(num + 0xb8);
          type = TOK_UINT64;
        }
        else {
          if (iVar2 != 0x53) {
LAB_0010ade3:
            iVar2 = isalnum(*(int *)(num + 0xb0));
            if (iVar2 != 0) goto LAB_0010ad28;
            getCurrentCursor(&local_48,(Lexer *)num);
            this_00 = (NumberToken *)operator_new(0x38);
            goto LAB_0010ae5f;
          }
          nextChar((Lexer *)num);
          getCurrentCursor(&local_48,(Lexer *)num);
          this_00 = (NumberToken *)operator_new(0x38);
          last = *(Token **)(num + 0xb8);
          type = TOK_UINT16;
        }
      }
      else if (iVar2 == 0x6c) {
        nextChar((Lexer *)num);
        getCurrentCursor(&local_48,(Lexer *)num);
        this_00 = (NumberToken *)operator_new(0x38);
LAB_0010ae5f:
        last = *(Token **)(num + 0xb8);
        type = TOK_UINT32;
      }
      else {
        if (iVar2 != 0x73) goto LAB_0010ade3;
        nextChar((Lexer *)num);
        getCurrentCursor(&local_48,(Lexer *)num);
        this_00 = (NumberToken *)operator_new(0x38);
        last = *(Token **)(num + 0xb8);
        type = TOK_UINT8;
      }
    }
  }
  NumberToken::NumberToken(this_00,last,type,&local_48,in_RDX);
LAB_0010ae7c:
  iVar2 = isalnum(*(int *)(num + 0xb0));
  if (iVar2 == 0) {
    if (this_00 == (NumberToken *)0x0) {
      getCurrentCursor(&local_48,(Lexer *)num);
      this_00 = (NumberToken *)operator_new(0x38);
      NumberToken::NumberToken(this_00,*(Token **)(num + 0xb8),TOK_INT32,&local_48,in_RDX);
    }
    this->_vptr_Lexer = (_func_int **)this_00;
  }
  else {
    getCurrentCursor(&local_48,(Lexer *)num);
    sVar1 = *(size_t *)(num + 0xa8);
    local_30 = (Error<pfederc::LexerErrorCode> *)operator_new(0x38);
    local_30->logLevel = LVL_ERROR;
    local_30->err = LEX_ERR_NUM_UNEXPECTED_CHAR;
    (local_30->pos).line = local_48.line;
    (local_30->pos).startIndex = sVar1;
    (local_30->pos).endIndex = sVar1;
    (local_30->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_30->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_30->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                        *)num);
    if (local_30 != (Error<pfederc::LexerErrorCode> *)0x0) {
      std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::LexerErrorCode>_> *)&local_30,local_30);
    }
    if (this_00 != (NumberToken *)0x0) {
      (*(this_00->super_Token)._vptr_Token[1])(this_00);
    }
  }
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenNumType(std::uint64_t num) noexcept {
  if (isdigit(currentChar))
    return generateError(std::make_unique<LexerError>(LVL_ERROR,
      LexerErrorCode::LEX_ERR_NUM_UNEXPECTED_CHAR_DIGIT, Position{getCurrentCursor().line,
        currentEndIndex, currentEndIndex}));

  std::unique_ptr<Token> tok(nullptr);
  switch (currentChar) {
  case 'u':
    switch (nextChar()) {
      case 's':
        nextChar();
        tok = std::make_unique<NumberToken>(currentToken, TokenType::TOK_UINT8,
          getCurrentCursor(), num);
        break;
      case 'S':
        nextChar();
        tok = std::make_unique<NumberToken>(currentToken, TokenType::TOK_UINT16,
          getCurrentCursor(), num);
        break;
      case 'l':
        nextChar();
        tok = std::make_unique<NumberToken>(currentToken, TokenType::TOK_UINT32,
          getCurrentCursor(), num);
        break;
      case 'L':
        nextChar();
        tok = std::make_unique<NumberToken>(currentToken, TokenType::TOK_UINT64,
          getCurrentCursor(), num);
        break;
      default:
        if (!isalnum(currentChar))
          tok = std::make_unique<NumberToken>(currentToken, TokenType::TOK_UINT32,
            getCurrentCursor(), num);
        break;
    }
    break;
  case 's':
    nextChar();
    tok = std::make_unique<NumberToken>(currentToken, TokenType::TOK_INT8,
      getCurrentCursor(), num);
    break;
  case 'S':
    nextChar();
    tok = std::make_unique<NumberToken>(currentToken, TokenType::TOK_INT16,
      getCurrentCursor(), num);
    break;
  case 'l':
    nextChar();
    break;
  case 'L':
    nextChar();
    tok = std::make_unique<NumberToken>(currentToken, TokenType::TOK_INT64,
      getCurrentCursor(), num);
    break;
  default:
    break;
  }

  if (isalnum(currentChar))
    return generateError(std::make_unique<LexerError>(LVL_ERROR,
      LexerErrorCode::LEX_ERR_NUM_UNEXPECTED_CHAR, Position{getCurrentCursor().line,
        currentEndIndex, currentEndIndex}));

  if (!tok)
    return std::make_unique<NumberToken>(currentToken, TokenType::TOK_INT32,
      getCurrentCursor(), num);

  return tok;
}